

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cpp
# Opt level: O2

void __thiscall
ArgParser::add(ArgParser *this,string *var,string *name,string *shortName,string *description,
              bool optional)

{
  ArgHolder arg;
  string sStack_168;
  string local_148;
  string local_128;
  ArgHolder local_108;
  
  std::__cxx11::string::string((string *)&local_128,(string *)name);
  std::__cxx11::string::string((string *)&local_148,(string *)shortName);
  std::__cxx11::string::string((string *)&sStack_168,(string *)description);
  ArgHolder::ArgHolder(&local_108,&local_128,&local_148,&sStack_168,optional);
  std::__cxx11::string::~string((string *)&sStack_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  local_108.argType = ARG_STRING;
  local_108.varSTRING = var;
  std::vector<ArgHolder,_std::allocator<ArgHolder>_>::push_back(&this->m_args,&local_108);
  ArgHolder::~ArgHolder(&local_108);
  return;
}

Assistant:

void ArgParser::add(std::string *var,
                    std::string name, std::string shortName, std::string description,
                    bool optional)
{
    ArgHolder arg(name, shortName, description, optional);
    arg.varSTRING = var;
    arg.argType = ARG_STRING;
    m_args.push_back(arg);
}